

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data_00;
  int iVar1;
  int result_1;
  int result;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if (((data_00->progress).flags & 0x10U) == 0) {
    if ((data_00->set).fxferinfo != (curl_xferinfo_callback)0x0) {
      Curl_set_in_callback(data_00,true);
      iVar1 = (*(data_00->set).fxferinfo)
                        ((data_00->set).progress_client,(data_00->progress).size_dl,
                         (data_00->progress).downloaded,(data_00->progress).size_ul,
                         (data_00->progress).uploaded);
      Curl_set_in_callback(data_00,false);
      if (iVar1 == 0) {
        return 0;
      }
      Curl_failf(data_00,"Callback aborted");
      return iVar1;
    }
    if ((data_00->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data_00,true);
      iVar1 = (*(data_00->set).fprogress)
                        ((data_00->set).progress_client,(double)(data_00->progress).size_dl,
                         (double)(data_00->progress).downloaded,(double)(data_00->progress).size_ul,
                         (double)(data_00->progress).uploaded);
      Curl_set_in_callback(data_00,false);
      if (iVar1 == 0) {
        return 0;
      }
      Curl_failf(data_00,"Callback aborted");
      return iVar1;
    }
  }
  progress_meter(conn);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
  }
  progress_meter(conn);

  return 0;
}